

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollFromPosX(ImGuiWindow *window,float param_2,float center_x_ratio)

{
  float center_x_ratio_local;
  float local_x_local;
  ImGuiWindow *window_local;
  
  if (center_x_ratio < 0.0 || 1.0 < center_x_ratio) {
    __assert_fail("center_x_ratio >= 0.0f && center_x_ratio <= 1.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2529,"void ImGui::SetScrollFromPosX(ImGuiWindow *, float, float)");
  }
  (window->ScrollTarget).x = (float)(int)(param_2 + (window->Scroll).x);
  (window->ScrollTargetCenterRatio).x = center_x_ratio;
  (window->ScrollTargetEdgeSnapDist).x = 0.0;
  return;
}

Assistant:

void ImGui::SetScrollFromPosX(ImGuiWindow* window, float local_x, float center_x_ratio)
{
    IM_ASSERT(center_x_ratio >= 0.0f && center_x_ratio <= 1.0f);
    window->ScrollTarget.x = IM_FLOOR(local_x + window->Scroll.x); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.x = center_x_ratio;
    window->ScrollTargetEdgeSnapDist.x = 0.0f;
}